

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Acceptor.h
# Opt level: O3

int __thiscall
Acceptor<Client>::accept(Acceptor<Client> *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int socket;
  undefined8 *puVar1;
  undefined4 in_register_00000034;
  long lVar2;
  uint *local_38;
  undefined8 local_30;
  uint local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  socket = ::accept(*(int *)(lVar2 + 8),(sockaddr *)(lVar2 + 0x10),(socklen_t *)(lVar2 + 0xc));
  if (-1 < socket) {
    Client::Client((Client *)this,socket);
    return (int)this;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x28);
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Accept","");
  *puVar1 = &PTR__AcceptException_0010ca70;
  puVar1[1] = puVar1 + 3;
  if (local_38 == &local_28) {
    *(uint *)(puVar1 + 3) = local_28;
    *(undefined4 *)((long)puVar1 + 0x1c) = uStack_24;
    *(undefined4 *)(puVar1 + 4) = uStack_20;
    *(undefined4 *)((long)puVar1 + 0x24) = uStack_1c;
  }
  else {
    puVar1[1] = local_38;
    puVar1[3] = CONCAT44(uStack_24,local_28);
  }
  puVar1[2] = local_30;
  local_30 = 0;
  local_28 = local_28 & 0xffffff00;
  local_38 = &local_28;
  __cxa_throw(puVar1,&AcceptException::typeinfo,AcceptException::~AcceptException);
}

Assistant:

T Acceptor<T>::accept() { 
    int new_socket;
    if ((new_socket = ::accept(server_fd, (sockaddr *)&address,  
                       (socklen_t*)&addrlen))<0) { 
        throw AcceptException("Accept");
    } 

    return T(new_socket);
}